

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

TBoard * makeBoard(short k)

{
  ulong uVar1;
  ulong uVar2;
  TBoard *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  
  uVar1 = CONCAT44(in_XMM0_Db,in_XMM0_Da) & 0xffff0000ffff | (ulong)(ushort)(k % 3) << 0x10;
  uVar2 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc) & 0xffff0000ffff;
  in_RDI->_M_elems[0]._M_elems[0] = (int)uVar1 >> 0x10;
  in_RDI->_M_elems[0]._M_elems[1] =
       (int)((long)(uVar1 | (ulong)(ushort)((k / 3) % 3) << 0x30) >> 0x30);
  in_RDI->_M_elems[0]._M_elems[2] = (int)((uint)uVar2 | (uint)(ushort)((k / 9) % 3) << 0x10) >> 0x10
  ;
  in_RDI->_M_elems[1]._M_elems[0] =
       (int)((uint)(uVar2 >> 0x20) | (uint)(((ulong)(ushort)((k / 0x1b) % 3) << 0x30) >> 0x20)) >>
       0x10;
  in_RDI->_M_elems[1]._M_elems[1] = (int)(short)((k / 0x51) % 3);
  in_RDI->_M_elems[1]._M_elems[2] = (int)(short)((k / 0xf3) % 3);
  in_RDI->_M_elems[2]._M_elems[0] = (int)(char)((char)(k / 0x2d9) % '\x03');
  in_RDI->_M_elems[2]._M_elems[1] = (int)(char)((char)(k / 0x88b) % '\x03');
  in_RDI->_M_elems[2]._M_elems[2] = (int)(char)((char)(k / 0x19a1) % '\x03');
  return in_RDI;
}

Assistant:

TBoard
makeBoard(short k)
{
    return {{{{k / g_factors[0] % 3, k / g_factors[1] % 3, k / g_factors[2] % 3}},
             {{k / g_factors[3] % 3, k / g_factors[4] % 3, k / g_factors[5] % 3}},
             {{k / g_factors[6] % 3, k / g_factors[7] % 3, k / g_factors[8] % 3}}}};
}